

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

QString * QDir::currentPath(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEngine::currentPath();
  QFileSystemEntry::filePath(in_RDI,&local_50);
  QFileSystemEntry::~QFileSystemEntry(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::currentPath()
{
    return QFileSystemEngine::currentPath().filePath();
}